

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common_functions.h
# Opt level: O1

void TestValueFunction(Arguments *args)

{
  ostream *poVar1;
  long *plVar2;
  int iVar3;
  tms timeStruct;
  JointPolicyPureVector jpol;
  ValueFunctionDecPOMDPDiscrete V;
  JESPExhaustivePlanner plan;
  ProblemDecTiger pu;
  tms local_700;
  JointPolicyPureVector local_6e0 [152];
  ValueFunctionDecPOMDPDiscrete local_648 [120];
  DecPOMDPDiscreteInterface local_5d0 [2];
  code *local_5a8 [99];
  shared_count local_290 [2];
  ProblemDecTiger local_280;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-------------------",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"TestValueFunction()",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-------------------",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"horizon=",8);
  plVar2 = (long *)std::ostream::operator<<(poVar1,4);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  ProblemDecTiger::ProblemDecTiger(&local_280);
  JESPExhaustivePlanner::JESPExhaustivePlanner
            ((JESPExhaustivePlanner *)local_5d0,4,
             (DecPOMDPDiscreteInterface *)
             (&local_280.super_DecPOMDPDiscrete + *(long *)(local_280._0_8_ + -0x50)),
             (PlanningUnitMADPDiscreteParameters *)0x0);
  PlanningUnitDecPOMDPDiscrete::SetProblem(local_5d0);
  MultiAgentDecisionProcessDiscrete::Print((MultiAgentDecisionProcessDiscrete *)&local_280);
  PlanningUnitMADPDiscrete::Print();
  JointPolicyPureVector::JointPolicyPureVector
            (local_6e0,(Interface_ProblemToPolicyDiscretePure *)local_5a8);
  if (args->testMode == false) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    poVar1 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"Press <enter> to start value (v0) calculation of ",0x31);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,1000);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1," joint policies without caching.",0x20);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    std::istream::get();
  }
  times(&local_700);
  iVar3 = 1000;
  do {
    JPolComponent_VectorImplementation::RandomInitialization();
    ValueFunctionDecPOMDPDiscrete::ValueFunctionDecPOMDPDiscrete
              (local_648,(PlanningUnitDecPOMDPDiscrete *)local_5d0,
               (JointPolicyDiscretePure *)local_6e0);
    ValueFunctionDecPOMDPDiscrete::CalculateV<false>();
    ValueFunctionDecPOMDPDiscrete::~ValueFunctionDecPOMDPDiscrete(local_648);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  times(&local_700);
  if (args->testMode == false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"done in ",8);
    poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," clock ticks.",0xd);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Now starting value (v0) calculation of ",0x27);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,1000);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," joint policies with caching.",0x1d);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  times(&local_700);
  iVar3 = 1000;
  do {
    JPolComponent_VectorImplementation::RandomInitialization();
    ValueFunctionDecPOMDPDiscrete::ValueFunctionDecPOMDPDiscrete
              (local_648,(PlanningUnitDecPOMDPDiscrete *)local_5d0,
               (JointPolicyDiscretePure *)local_6e0);
    ValueFunctionDecPOMDPDiscrete::CalculateV<true>();
    ValueFunctionDecPOMDPDiscrete::~ValueFunctionDecPOMDPDiscrete(local_648);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  times(&local_700);
  if (args->testMode == false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"done in ",8);
    poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," clock ticks.",0xd);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  if (args->testMode == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"press <enter> to continue...",0x1c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    std::istream::get();
  }
  JointPolicyPureVector::~JointPolicyPureVector(local_6e0);
  local_5d0[0]._0_8_ = MADPComponentDiscreteObservations::GetNrJointObservations;
  local_5a8[0] = ProblemDecTiger::ProblemDecTiger;
  boost::detail::shared_count::~shared_count(local_290);
  PlanningUnitMADPDiscrete::~PlanningUnitMADPDiscrete((PlanningUnitMADPDiscrete *)local_5d0);
  DecPOMDPDiscrete::~DecPOMDPDiscrete(&local_280.super_DecPOMDPDiscrete);
  return;
}

Assistant:

void TestValueFunction(const ArgumentHandlers::Arguments& args)
{
    cout << "-------------------"<<endl;
    cout << "TestValueFunction()"<<endl;
    cout << "-------------------"<<endl;
    int horizon = 4;
    cout << endl << "horizon="<< horizon <<endl;
    ProblemDecTiger pu;
    JESPExhaustivePlanner plan(horizon, &pu);
    plan.SetProblem(&pu);

    pu.Print();
    plan.Print();

    JointPolicyPureVector jpol(&plan);
    
    //ValueFunctionDecPOMDPDiscrete Vtest(plan, jpol);
    //Vtest.Test();

    //the time structure...
    tms timeStruct;
    

    int nrLoops = 1000;
    if (!args.testMode)
    {
        cout << endl <<"Press <enter> to start value (v0) calculation of "<<nrLoops
             <<" joint policies without caching."<<endl;
        cin.get();
    }

    clock_t ticks_before, ticks_after;
    ticks_before = times(&timeStruct);
    for(int i=0; i < nrLoops; i++)
    {
        jpol.RandomInitialization();
        ValueFunctionDecPOMDPDiscrete V(plan, jpol);
        /*double val =*/ V.CalculateV<false>();
    }
    ticks_after = times(&timeStruct);
    if (!args.testMode)
        cout << "done in "<< ticks_after - ticks_before << " clock ticks."<<endl;
    cout << "Now starting value (v0) calculation of "<<nrLoops<<
        " joint policies with caching."<<endl;
    ticks_before = times(&timeStruct);
    for(int i=0; i < nrLoops; i++)
    {
        jpol.RandomInitialization();
        ValueFunctionDecPOMDPDiscrete V(plan, jpol);
        /*double val =*/ V.CalculateV<true>();
    }    
    ticks_after = times(&timeStruct);
    if (!args.testMode)
        cout << "done in "<< ticks_after - ticks_before << " clock ticks."<<endl;

    if (!args.testMode)
    {
        cout << "press <enter> to continue..."<<endl;
        cin.get();
    }
    
}